

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

DataTypeSyntax * __thiscall
slang::parsing::Parser::parseDataType
          (Parser *this,bitmask<slang::parsing::detail::TypeOptions> options)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  SyntaxKind SVar3;
  IntegerTypeSyntax *pIVar4;
  SourceLocation SVar5;
  KeywordTypeSyntax *pKVar6;
  StructUnionTypeSyntax *pSVar7;
  NameSyntax *pNVar8;
  NamedTypeSyntax *pNVar9;
  ExpressionSyntax *expr;
  TypeReferenceSyntax *pTVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ParameterValueAssignmentSyntax *parameters;
  DotMemberClauseSyntax *modport;
  VirtualInterfaceTypeSyntax *pVVar13;
  EnumTypeSyntax *pEVar14;
  ImplicitTypeSyntax *pIVar15;
  uint uVar16;
  Token TVar17;
  Token TVar18;
  Token signing;
  Token TVar19;
  Token interfaceKeyword;
  uint32_t index;
  uint32_t local_ac;
  Info *local_a8;
  Info *local_a0;
  Token local_98;
  Token local_88;
  SyntaxList<slang::syntax::VariableDimensionSyntax> local_78;
  Token local_40;
  
  bVar2 = ParserBase::peek(&this->super_ParserBase,WireKeyword);
  if (bVar2) {
    ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x100be0005);
  }
  TVar17 = ParserBase::peek(&this->super_ParserBase);
  SVar3 = slang::syntax::SyntaxFacts::getIntegerType(TVar17.kind);
  if (SVar3 != Unknown) {
    TVar17 = ParserBase::consume(&this->super_ParserBase);
    TVar18 = parseSigning(this);
    local_78.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> =
         parseDimensionList(this);
    local_78.super_SyntaxListBase.childCount =
         (size_t)local_78.
                 super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
                 _M_extent._M_extent_value;
    local_78.super_SyntaxListBase.super_SyntaxNode.kind = 1;
    local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005ae338;
    pIVar4 = slang::syntax::SyntaxFactory::integerType(&this->factory,SVar3,TVar17,TVar18,&local_78)
    ;
    return &pIVar4->super_DataTypeSyntax;
  }
  uVar16 = TVar17._0_4_ & 0xffff;
  SVar3 = slang::syntax::SyntaxFacts::getKeywordType(TVar17.kind);
  if (SVar3 != Unknown) {
    if ((SVar3 == VoidType) && ((options.m_bits & 2) == 0)) {
      local_78.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
      SVar5 = Token::location((Token *)&local_78);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xbd0005,SVar5);
    }
    TVar17 = ParserBase::consume(&this->super_ParserBase);
    pKVar6 = slang::syntax::SyntaxFactory::keywordType(&this->factory,SVar3,TVar17);
    return &pKVar6->super_DataTypeSyntax;
  }
  if (uVar16 < 0x138) {
    if (uVar16 == 2) {
      if ((options.m_bits & 1) == 0) goto LAB_002f3976;
      local_ac = 0;
      bVar2 = scanQualifiedName(this,&local_ac,false);
      if (((bVar2) && (bVar2 = scanDimensionList(this,&local_ac), bVar2)) &&
         (TVar17 = ParserBase::peek(&this->super_ParserBase,local_ac), TVar17.kind == Identifier)) {
        pNVar8 = parseName(this);
        pNVar9 = slang::syntax::SyntaxFactory::namedType(&this->factory,pNVar8);
        return &pNVar9->super_DataTypeSyntax;
      }
      Token::Token(&local_40);
      local_78.super_SyntaxListBase.super_SyntaxNode.kind = 1;
      local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_78.super_SyntaxListBase.childCount = 0;
      local_78.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> =
           (span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>)ZEXT816(0);
      local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005ae338;
      TVar19 = ParserBase::placeholderToken(&this->super_ParserBase);
      signing.info = local_40.info;
      signing.kind = local_40.kind;
      signing._2_1_ = local_40._2_1_;
      signing.numFlags.raw = local_40.numFlags.raw;
      signing.rawLen = local_40.rawLen;
      goto LAB_002f3b7e;
    }
    if (uVar16 == 0xa1) {
      pEVar14 = parseEnum(this);
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)pEVar14;
      (pEVar14->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode = pSVar1;
      return &pEVar14->super_DataTypeSyntax;
    }
    if (uVar16 == 0x121) {
      SVar3 = StructType;
      goto LAB_002f389f;
    }
  }
  else if (uVar16 < 0x145) {
    if (uVar16 == 0x138) {
      TVar17 = ParserBase::consume(&this->super_ParserBase);
      TVar18 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
      expr = parseExpression(this);
      local_98 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      pTVar10 = slang::syntax::SyntaxFactory::typeReference
                          (&this->factory,TVar17,TVar18,expr,local_98);
      return &pTVar10->super_DataTypeSyntax;
    }
    if (uVar16 == 0x13a) {
      SVar3 = UnionType;
LAB_002f389f:
      pSVar7 = parseStructUnion(this,SVar3);
      return &pSVar7->super_DataTypeSyntax;
    }
  }
  else {
    if (uVar16 == 0x145) {
      TVar17 = ParserBase::consume(&this->super_ParserBase);
      local_a0 = TVar17.info;
      uVar11 = TVar17._0_8_;
      TVar17 = ParserBase::consumeIf(&this->super_ParserBase,InterfaceKeyword);
      local_a8 = TVar17.info;
      uVar12 = TVar17._0_8_;
      TVar17 = ParserBase::expect(&this->super_ParserBase,Identifier);
      parameters = parseParameterValueAssignment(this);
      local_88 = TVar17;
      modport = parseDotMemberClause(this);
      TVar19.info = local_a0;
      TVar19.kind = (short)uVar11;
      TVar19._2_1_ = (char)((ulong)uVar11 >> 0x10);
      TVar19.numFlags.raw = (char)((ulong)uVar11 >> 0x18);
      TVar19.rawLen = (int)((ulong)uVar11 >> 0x20);
      interfaceKeyword.info = local_a8;
      interfaceKeyword.kind = (short)uVar12;
      interfaceKeyword._2_1_ = (char)((ulong)uVar12 >> 0x10);
      interfaceKeyword.numFlags.raw = (char)((ulong)uVar12 >> 0x18);
      interfaceKeyword.rawLen = (int)((ulong)uVar12 >> 0x20);
      pVVar13 = slang::syntax::SyntaxFactory::virtualInterfaceType
                          (&this->factory,TVar19,interfaceKeyword,local_88,parameters,modport);
      return &pVVar13->super_DataTypeSyntax;
    }
    if (uVar16 == 0x155) {
LAB_002f3976:
      pNVar8 = parseName(this);
      pNVar9 = slang::syntax::SyntaxFactory::namedType(&this->factory,pNVar8);
      return &pNVar9->super_DataTypeSyntax;
    }
  }
  signing = parseSigning(this);
  local_78.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> =
       parseDimensionList(this);
  local_78.super_SyntaxListBase.childCount =
       (size_t)local_78.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
               ._M_extent._M_extent_value;
  if ((options.m_bits & 1) == 0) {
    local_78.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
    SVar5 = Token::location((Token *)&local_78);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x610005,SVar5);
  }
  local_78.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005ae338;
  TVar19 = ParserBase::placeholderToken(&this->super_ParserBase);
LAB_002f3b7e:
  pIVar15 = slang::syntax::SyntaxFactory::implicitType(&this->factory,signing,&local_78,TVar19);
  return &pIVar15->super_DataTypeSyntax;
}

Assistant:

DataTypeSyntax& Parser::parseDataType(bitmask<TypeOptions> options) {
    if (peek(TokenKind::WireKeyword))
        skipToken(diag::WireDataType);

    auto kind = peek().kind;
    auto type = getIntegerType(kind);
    if (type != SyntaxKind::Unknown) {
        auto keyword = consume();
        auto signing = parseSigning();
        return factory.integerType(type, keyword, signing, parseDimensionList());
    }

    type = getKeywordType(kind);
    if (type != SyntaxKind::Unknown) {
        if (type == SyntaxKind::VoidType && (options & TypeOptions::AllowVoid) == 0)
            addDiag(diag::VoidNotAllowed, peek().location());
        return factory.keywordType(type, consume());
    }

    switch (kind) {
        case TokenKind::StructKeyword:
            return parseStructUnion(SyntaxKind::StructType);
        case TokenKind::UnionKeyword:
            return parseStructUnion(SyntaxKind::UnionType);
        case TokenKind::EnumKeyword: {
            auto& result = parseEnum();
            result.previewNode = std::exchange(previewNode, &result);
            return result;
        }
        case TokenKind::VirtualKeyword: {
            auto virtualKeyword = consume();
            auto interfaceKeyword = consumeIf(TokenKind::InterfaceKeyword);
            auto name = expect(TokenKind::Identifier);
            auto parameters = parseParameterValueAssignment();
            return factory.virtualInterfaceType(virtualKeyword, interfaceKeyword, name, parameters,
                                                parseDotMemberClause());
        }
        case TokenKind::UnitSystemName:
            return factory.namedType(parseName());
        case TokenKind::TypeKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& expr = parseExpression();
            return factory.typeReference(keyword, openParen, expr,
                                         expect(TokenKind::CloseParenthesis));
        }
        default:
            break;
    }

    if (kind == TokenKind::Identifier) {
        if ((options & TypeOptions::AllowImplicit) == 0)
            return factory.namedType(parseName());
        else {
            // If we're allowed to have an implicit type here, it means there's a chance this
            // identifier is actually the name of something else (like a declaration) and that the
            // type should be implicit. Check if there's another identifier right after us
            // before deciding which one we're looking at.
            uint32_t index = 0;
            if (scanQualifiedName(index, /* allowNew */ false) && scanDimensionList(index) &&
                peek(index).kind == TokenKind::Identifier) {
                return factory.namedType(parseName());
            }

            return factory.implicitType(Token(), nullptr, placeholderToken());
        }
    }

    auto signing = parseSigning();
    auto dimensions = parseDimensionList();

    if ((options & TypeOptions::AllowImplicit) == 0)
        addDiag(diag::ImplicitNotAllowed, peek().location());

    return factory.implicitType(signing, dimensions, placeholderToken());
}